

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O0

void __thiscall
MeCab::Tokenizer<mecab_node_t,_mecab_path_t>::Tokenizer(Tokenizer<mecab_node_t,_mecab_path_t> *this)

{
  undefined8 *in_RDI;
  size_t in_stack_ffffffffffffffa8;
  FreeList<mecab_dictionary_info_t> *in_stack_ffffffffffffffb0;
  whatlog *this_00;
  scoped_string *in_stack_ffffffffffffffc0;
  CharProperty *this_01;
  
  *in_RDI = &PTR__Tokenizer_001c66e8;
  this_01 = (CharProperty *)(in_RDI + 1);
  std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>::vector
            ((vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_> *)0x131a7f);
  Dictionary::Dictionary((Dictionary *)(in_RDI + 4));
  scoped_string::scoped_string(in_stack_ffffffffffffffc0);
  scoped_string::scoped_string((scoped_string *)(in_RDI + 0x52));
  FreeList<mecab_dictionary_info_t>::FreeList(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  this_00 = (whatlog *)(in_RDI + 0x5b);
  std::
  vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
  ::vector((vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
            *)0x131af7);
  in_RDI[0x5e] = 0;
  CharInfo::CharInfo((CharInfo *)(in_RDI + 0x5f));
  CharProperty::CharProperty(this_01);
  in_RDI[0x9b] = 0;
  whatlog::whatlog(this_00);
  return;
}

Assistant:

Tokenizer<N, P>::Tokenizer()
    : dictionary_info_freelist_(4),
      dictionary_info_(0),
      max_grouping_size_(0) {}